

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.h
# Opt level: O2

int CVmObjBigNum::compute_eq_exact(char *ext1,char *ext2)

{
  ushort uVar1;
  ushort uVar2;
  ulong uVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  char *pcVar10;
  ulong uVar11;
  
  if (((ext1[4] & 6U) == 0) && ((ext2[4] & 6U) == 0)) {
    uVar1 = *(ushort *)ext1;
    uVar2 = *(ushort *)ext2;
    uVar9 = (uint)uVar1;
    if (uVar1 < uVar2) {
      uVar9 = (uint)uVar2;
    }
    uVar6 = (uint)uVar2;
    pcVar10 = (char *)0x0;
    if (uVar1 < uVar2) {
      uVar6 = (uint)uVar1;
      pcVar10 = ext2;
    }
    if (uVar2 < uVar1) {
      pcVar10 = ext1;
    }
    if ((((ext2[4] ^ ext1[4]) & 1U) == 0) && (*(short *)(ext1 + 2) == *(short *)(ext2 + 2))) {
      uVar7 = (ulong)uVar6;
      bVar5 = 0;
      uVar11 = 0;
      do {
        if (uVar7 == uVar11) {
          if (pcVar10 != (char *)0x0) {
            iVar8 = uVar6 * 4;
            while (uVar9 != uVar7) {
              uVar11 = uVar7 >> 1;
              bVar5 = (byte)iVar8;
              uVar7 = uVar7 + 1;
              iVar8 = iVar8 + 4;
              if (((byte)pcVar10[uVar11 + 5] >> (~bVar5 & 4) & 0xf) != 0) {
                return 0;
              }
            }
          }
          return 1;
        }
        uVar3 = uVar11 >> 1;
        bVar4 = ~bVar5;
        uVar11 = uVar11 + 1;
        bVar5 = bVar5 + 4;
      } while (((byte)(ext2[uVar3 + 5] ^ ext1[uVar3 + 5]) >> (bVar4 & 4) & 0xf) == 0);
      return 0;
    }
  }
  return 0;
}

Assistant:

static int get_type(const char *ext)
        { return ext[VMBN_FLAGS] & VMBN_F_TYPE_MASK; }